

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c2mir.c
# Opt level: O3

op_t * modify_for_block_move(op_t *__return_storage_ptr__,c2m_ctx_t c2m_ctx,op_t mem,op_t index)

{
  MIR_context_t ctx;
  op_t oVar1;
  op_t *poVar2;
  MIR_insn_t_conflict pMVar3;
  uint in_ECX;
  byte in_DL;
  MIR_insn_code_t code;
  MIR_context_t ctx_00;
  op_t local_1b8;
  MIR_disp_t MStack_164;
  op_t *local_150;
  decl_t local_148;
  undefined8 uStack_140;
  decl_t pdStack_138;
  undefined8 uStack_130;
  decl_t local_128;
  undefined8 uStack_120;
  MIR_reg_t MStack_118;
  MIR_disp_t MStack_100;
  
  oVar1 = mem;
  if (((mem.mir_op.u.mem.base != 0) && (mem.mir_op._8_1_ == '\n')) &&
     (poVar2 = (op_t *)(ulong)in_DL, in_DL == 1)) {
    local_150 = __return_storage_ptr__;
    if (mem.mir_op.u.mem.index != 0) {
      ctx = c2m_ctx->ctx;
      get_new_temp(&local_1b8,c2m_ctx,MIR_T_I64);
      pdStack_138 = (decl_t)CONCAT44(local_1b8.mir_op.data._4_4_,(MIR_reg_t)local_1b8.mir_op.data);
      uStack_130._4_4_ = local_1b8.mir_op._12_4_;
      uStack_130._0_4_ = local_1b8.mir_op._8_4_;
      local_148 = local_1b8.decl;
      uStack_140 = local_1b8._8_8_;
      MStack_164 = local_1b8.mir_op.u.mem.disp;
      if ((ulong)mem.mir_op.u.mem.scale == 1) {
        MIR_new_reg_op(ctx,mem.mir_op.u.mem.index);
        code = MIR_MOV;
        local_1b8.mir_op.u.mem.nonalias = (MIR_alias_t)MStack_164;
        local_1b8.mir_op.u.mem.nloc = (uint32_t)((ulong)MStack_164 >> 0x20);
        ctx_00 = c2m_ctx->ctx;
      }
      else {
        MIR_new_reg_op(ctx,mem.mir_op.u.mem.index);
        MIR_new_int_op(ctx,(ulong)mem.mir_op.u.mem.scale);
        code = MIR_MUL;
        local_1b8.mir_op.u.mem.nonalias = (MIR_alias_t)MStack_164;
        local_1b8.mir_op.u.mem.nloc = (uint32_t)((ulong)MStack_164 >> 0x20);
        ctx_00 = c2m_ctx->ctx;
      }
      pMVar3 = MIR_new_insn(ctx_00,code);
      emit_insn_opt(c2m_ctx,pMVar3);
      MIR_new_reg_op(ctx,mem.mir_op.u.mem.base);
      local_1b8.decl = pdStack_138;
      local_1b8._8_8_ = uStack_130;
      local_1b8.mir_op.data._0_4_ = local_1b8.mir_op.u.reg;
      local_128 = pdStack_138;
      uStack_120 = uStack_130;
      MStack_118 = local_1b8.mir_op.u.reg;
      local_1b8.mir_op.u.mem.nonalias = (MIR_alias_t)MStack_164;
      local_1b8.mir_op.u.mem.nloc = (uint32_t)((ulong)MStack_164 >> 0x20);
      MStack_100 = MStack_164;
      pMVar3 = MIR_new_insn(c2m_ctx->ctx,MIR_ADD);
      emit_insn_opt(c2m_ctx,pMVar3);
      poVar2 = (op_t *)(ulong)in_ECX;
      mem.mir_op.u.mem.base = local_1b8.mir_op.u.reg;
    }
    local_150->decl = mem.decl;
    *(undefined8 *)&local_150->field_0x8 = mem._8_8_;
    (local_150->mir_op).data = mem.mir_op.data;
    *(long *)&(local_150->mir_op).field_0x8 = oVar1.mir_op._8_8_;
    *(ulong *)&(local_150->mir_op).u =
         (ulong)CONCAT22(mem.mir_op.u.reg._2_2_,CONCAT11(1,mem.mir_op.u.reg._0_1_));
    (local_150->mir_op).u.str.s = (char *)((ulong)mem.mir_op.u.mem.nloc << 0x20);
    *(ulong *)((long)&(local_150->mir_op).u + 0x10) = CONCAT44(in_ECX,mem.mir_op.u.mem.base);
    (local_150->mir_op).u.mem.disp = mem.mir_op.u.mem.disp;
    return poVar2;
  }
  __assert_fail("mem.mir_op.u.mem.base != 0 && mem.mir_op.mode == MIR_OP_MEM && index.mir_op.mode == MIR_OP_REG"
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/c2mir/c2mir.c"
                ,0x2b07,"op_t modify_for_block_move(c2m_ctx_t, op_t, op_t)");
}

Assistant:

static op_t modify_for_block_move (c2m_ctx_t c2m_ctx, op_t mem, op_t index) {
  MIR_context_t ctx = c2m_ctx->ctx;
  op_t base;

  assert (mem.mir_op.u.mem.base != 0 && mem.mir_op.mode == MIR_OP_MEM
          && index.mir_op.mode == MIR_OP_REG);
  if (mem.mir_op.u.mem.index == 0) {
    mem.mir_op.u.mem.index = index.mir_op.u.reg;
    mem.mir_op.u.mem.scale = 1;
  } else {
    base = get_new_temp (c2m_ctx, MIR_T_I64);
    if (mem.mir_op.u.mem.scale != 1)
      emit3 (c2m_ctx, MIR_MUL, base.mir_op, MIR_new_reg_op (ctx, mem.mir_op.u.mem.index),
             MIR_new_int_op (ctx, mem.mir_op.u.mem.scale));
    else
      emit2 (c2m_ctx, MIR_MOV, base.mir_op, MIR_new_reg_op (ctx, mem.mir_op.u.mem.index));
    emit3 (c2m_ctx, MIR_ADD, base.mir_op, base.mir_op, MIR_new_reg_op (ctx, mem.mir_op.u.mem.base));
    mem.mir_op.u.mem.base = base.mir_op.u.reg;
    mem.mir_op.u.mem.index = index.mir_op.u.reg;
    mem.mir_op.u.mem.scale = 1;
  }
  mem.mir_op.u.mem.alias = mem.mir_op.u.mem.nonalias = 0;
  return mem;
}